

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::merge_with(Tree *this,Tree *src,size_t src_node,size_t dst_node)

{
  Location LVar1;
  Location LVar2;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  size_t sVar6;
  Tree *in_RCX;
  Tree *in_RDX;
  Tree *in_RSI;
  Tree *in_RDI;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  Tree *in_stack_00000030;
  size_t dch_1;
  size_t sch_1;
  size_t dch;
  size_t sch;
  char msg_1 [89];
  char msg [31];
  size_t child;
  size_t child_1;
  size_t in_stack_fffffffffffffb58;
  Tree *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  Tree *in_stack_fffffffffffffb70;
  Tree *in_stack_fffffffffffffb78;
  Tree *in_stack_fffffffffffffb80;
  Tree *pTVar7;
  size_t in_stack_fffffffffffffba8;
  Tree *pTVar8;
  Tree *in_stack_fffffffffffffbb0;
  Tree *pTVar9;
  Tree *in_stack_fffffffffffffbb8;
  Tree *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  pfn_error in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  pfn_error in_stack_fffffffffffffbe0;
  size_t local_3f8;
  size_t local_3d8;
  size_t local_3b0;
  Tree *pTStack_3a8;
  char *local_3a0;
  Tree *in_stack_fffffffffffffc68;
  Tree *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  Tree *in_stack_fffffffffffffc80;
  type_bits in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcb8;
  Tree *in_stack_fffffffffffffcc0;
  csubstr in_stack_fffffffffffffcc8;
  size_t local_320;
  Tree *pTStack_318;
  char *local_310;
  Tree *pTStack_308;
  Tree *local_300;
  char local_2f8 [24];
  undefined4 in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd24;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  size_t local_178;
  Tree *pTStack_170;
  char *local_168;
  Tree *pTStack_160;
  Tree *local_158;
  size_t local_150;
  Tree *pTStack_148;
  char *local_140;
  Tree *pTStack_138;
  Tree *local_130;
  size_t local_128;
  Tree *pTStack_120;
  char *local_118;
  Tree *pTStack_110;
  Tree *local_108;
  size_t local_d0;
  Tree *pTStack_c8;
  char *local_c0;
  Tree *pTStack_b8;
  Tree *local_b0;
  size_t local_a8;
  Tree *pTStack_a0;
  char *local_98;
  Tree *pTStack_90;
  Tree *local_88;
  size_t local_80;
  Tree *pTStack_78;
  char *local_70;
  Tree *pTStack_68;
  Tree *local_60;
  
  pTVar8 = in_RDI;
  if (in_RSI == (Tree *)0x0) {
    builtin_strncpy(local_2f8,"check failed: (src != nu",0x18);
    in_stack_fffffffffffffd20 = 0x74706c6c;
    in_stack_fffffffffffffd24 = 0x2972;
    in_stack_fffffffffffffd26 = 0;
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    in_stack_fffffffffffffbe0 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffbd8 = local_2f8;
    Location::Location((Location *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,
                       (size_t)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                       (size_t)in_stack_fffffffffffffb60);
    LVar1.super_LineCol.line = (size_t)pTStack_318;
    LVar1.super_LineCol.offset = local_320;
    LVar1.super_LineCol.col = (size_t)local_310;
    LVar1.name.str = (char *)pTStack_308;
    LVar1.name.len = (size_t)local_300;
    (*in_stack_fffffffffffffbe0)
              (in_stack_fffffffffffffbd8,0x1f,LVar1,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffb58 = local_320;
    in_stack_fffffffffffffb60 = pTStack_318;
    in_stack_fffffffffffffb68 = local_310;
    in_stack_fffffffffffffb70 = pTStack_308;
    in_stack_fffffffffffffb78 = local_300;
  }
  if (in_RDX == (Tree *)0xffffffffffffffff) {
    in_RDX = (Tree *)root_id(in_stack_fffffffffffffbb0);
  }
  if (in_RCX == (Tree *)0xffffffffffffffff) {
    in_RCX = (Tree *)root_id(in_stack_fffffffffffffbb0);
  }
  pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (((((pNVar5->m_type).type & VAL) == NOTYPE) &&
      (pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8),
      ((pNVar5->m_type).type & SEQ) == NOTYPE)) &&
     (pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8),
     ((pNVar5->m_type).type & MAP) == NOTYPE)) {
    memcpy(&stack0xfffffffffffffc78,
           "check failed: (src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node))"
           ,0x59);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    in_stack_fffffffffffffbd0 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffbc8 = &stack0xfffffffffffffc78;
    Location::Location((Location *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,
                       (size_t)in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68,
                       (size_t)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb78 = in_stack_fffffffffffffc70;
    in_stack_fffffffffffffb70 = in_stack_fffffffffffffc68;
    LVar2.super_LineCol.line = (size_t)pTStack_3a8;
    LVar2.super_LineCol.offset = local_3b0;
    LVar2.super_LineCol.col = (size_t)local_3a0;
    LVar2.name.str = (char *)in_stack_fffffffffffffb70;
    LVar2.name.len = (size_t)in_stack_fffffffffffffb78;
    in_stack_fffffffffffffc68 = in_stack_fffffffffffffb70;
    in_stack_fffffffffffffc70 = in_stack_fffffffffffffb78;
    (*in_stack_fffffffffffffbd0)
              (in_stack_fffffffffffffbc8,0x59,LVar2,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffb58 = local_3b0;
    in_stack_fffffffffffffb60 = pTStack_3a8;
    in_stack_fffffffffffffb68 = local_3a0;
  }
  pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if (((pNVar5->m_type).type & VAL) == NOTYPE) {
    pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
      pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      if (((pNVar5->m_type).type & MAP) == NOTYPE) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        handle_error(0x3f0daf,(char *)0x666f,"never reach this point");
      }
      else {
        pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        if (((pNVar5->m_type).type & MAP) == NOTYPE) {
          bVar3 = has_children(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          if (bVar3) {
            remove_children(in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
          }
          _clear_type(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
          if (((pNVar5->m_type).type & KEY) == NOTYPE) {
            to_map(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (type_bits)in_stack_fffffffffffffc70);
          }
          else {
            key(in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
            to_map(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc8,
                   in_stack_fffffffffffffcb0);
          }
        }
        local_3f8 = first_child(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        while (local_3f8 != 0xffffffffffffffff) {
          key(in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
          sVar6 = find_child(pTVar8,(size_t)in_RSI,(csubstr *)in_RDX);
          pTVar9 = in_RCX;
          if (sVar6 == 0xffffffffffffffff) {
            pTVar7 = in_RDI;
            pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
            sVar6 = pNVar5->m_last_child;
            if (in_RCX == (Tree *)0xffffffffffffffff) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                 (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
              loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
              loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
              loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
              loc_02.name.str = in_stack_fffffffffffffbd8;
              loc_02.name.len = (size_t)in_stack_fffffffffffffbe0;
              in_stack_fffffffffffffb58 = local_80;
              in_stack_fffffffffffffb60 = pTStack_78;
              in_stack_fffffffffffffb68 = local_70;
              in_stack_fffffffffffffb70 = pTStack_68;
              in_stack_fffffffffffffb78 = local_60;
              error<29ul>((char (*) [29])in_stack_fffffffffffffbb0,loc_02);
            }
            pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
            if ((((pNVar5->m_type).type & (STREAM|MAP)) == NOTYPE) &&
               (bVar3 = is_root(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8), !bVar3)) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                 (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
              loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
              loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
              loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
              loc_03.name.str = in_stack_fffffffffffffbd8;
              loc_03.name.len = (size_t)in_stack_fffffffffffffbe0;
              in_stack_fffffffffffffb58 = local_a8;
              in_stack_fffffffffffffb60 = pTStack_a0;
              in_stack_fffffffffffffb68 = local_98;
              in_stack_fffffffffffffb70 = pTStack_90;
              in_stack_fffffffffffffb78 = local_88;
              error<54ul>((char (*) [54])in_stack_fffffffffffffbb0,loc_03);
            }
            if ((sVar6 != 0xffffffffffffffff) &&
               (pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8),
               (Tree *)pNVar5->m_parent != in_RCX)) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                 (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
              loc_04.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
              loc_04.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
              loc_04.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
              loc_04.name.str = in_stack_fffffffffffffbd8;
              loc_04.name.len = (size_t)in_stack_fffffffffffffbe0;
              in_stack_fffffffffffffb58 = local_d0;
              in_stack_fffffffffffffb60 = pTStack_c8;
              in_stack_fffffffffffffb68 = local_c0;
              in_stack_fffffffffffffb70 = pTStack_b8;
              in_stack_fffffffffffffb78 = local_b0;
              error<63ul>((char (*) [63])in_stack_fffffffffffffbb0,loc_04);
            }
            _claim(in_RDX);
            _set_hierarchy(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
            _copy_props(pTVar7,(size_t)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                        (size_t)in_stack_fffffffffffffb68);
          }
          merge_with(in_RSI,in_RDX,(size_t)pTVar9,
                     CONCAT17(in_stack_fffffffffffffd27,
                              CONCAT16(in_stack_fffffffffffffd26,
                                       CONCAT24(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                                      )));
          local_3f8 = next_sibling(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          in_RCX = pTVar9;
        }
      }
    }
    else {
      pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      if (((pNVar5->m_type).type & SEQ) == NOTYPE) {
        bVar3 = has_children(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        if (bVar3) {
          remove_children(in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
        }
        _clear_type(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        if (((pNVar5->m_type).type & KEY) == NOTYPE) {
          to_seq(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 (type_bits)in_stack_fffffffffffffc70);
        }
        else {
          pTVar8 = in_RCX;
          key(in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
          to_seq(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc8,
                 in_stack_fffffffffffffcb0);
          in_stack_fffffffffffffbc0 = in_RCX;
          in_RCX = pTVar8;
        }
      }
      local_3d8 = first_child(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      while (local_3d8 != 0xffffffffffffffff) {
        pTVar8 = in_RDI;
        pTVar7 = in_RCX;
        pNVar5 = _p(in_RCX,(size_t)in_RDI);
        sVar6 = pNVar5->m_last_child;
        pTVar9 = in_RCX;
        if (in_RCX == (Tree *)0xffffffffffffffff) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                             (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          loc.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
          loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
          loc.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
          loc.name.str = in_stack_fffffffffffffbd8;
          loc.name.len = (size_t)in_stack_fffffffffffffbe0;
          in_stack_fffffffffffffb58 = local_128;
          in_stack_fffffffffffffb60 = pTStack_120;
          in_stack_fffffffffffffb68 = local_118;
          in_stack_fffffffffffffb70 = pTStack_110;
          in_stack_fffffffffffffb78 = local_108;
          error<29ul>((char (*) [29])pTVar9,loc);
        }
        pNVar5 = _p(pTVar9,(size_t)pTVar8);
        if ((((pNVar5->m_type).type & (STREAM|MAP)) == NOTYPE) &&
           (bVar3 = is_root(pTVar9,(size_t)pTVar8), !bVar3)) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                             (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
          loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
          loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
          loc_00.name.str = in_stack_fffffffffffffbd8;
          loc_00.name.len = (size_t)in_stack_fffffffffffffbe0;
          in_stack_fffffffffffffb58 = local_150;
          in_stack_fffffffffffffb60 = pTStack_148;
          in_stack_fffffffffffffb68 = local_140;
          in_stack_fffffffffffffb70 = pTStack_138;
          in_stack_fffffffffffffb78 = local_130;
          error<54ul>((char (*) [54])pTVar9,loc_00);
        }
        if ((sVar6 != 0xffffffffffffffff) &&
           (pNVar5 = _p(pTVar9,(size_t)pTVar8), (Tree *)pNVar5->m_parent != in_RCX)) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          Location::Location((Location *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                             (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffbc8;
          loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffbc0;
          loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffbd0;
          loc_01.name.str = in_stack_fffffffffffffbd8;
          loc_01.name.len = (size_t)in_stack_fffffffffffffbe0;
          in_stack_fffffffffffffb58 = local_178;
          in_stack_fffffffffffffb60 = pTStack_170;
          in_stack_fffffffffffffb68 = local_168;
          in_stack_fffffffffffffb70 = pTStack_160;
          in_stack_fffffffffffffb78 = local_158;
          error<63ul>((char (*) [63])pTVar9,loc_01);
        }
        _claim(in_RDX);
        _set_hierarchy(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
        _copy_props_wo_key(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68);
        merge_with(in_RSI,in_RDX,(size_t)pTVar7,
                   CONCAT17(in_stack_fffffffffffffd27,
                            CONCAT16(in_stack_fffffffffffffd26,
                                     CONCAT24(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)))
                  );
        local_3d8 = next_sibling(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        in_RCX = pTVar7;
      }
    }
  }
  else {
    pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if ((((pNVar5->m_type).type & VAL) == NOTYPE) &&
       (bVar3 = has_children(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58), bVar3)) {
      remove_children(in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
    }
    pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (((pNVar5->m_type).type & KEYVAL) == KEYVAL) {
      _copy_props(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78,
                  in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68);
    }
    else {
      pNVar5 = _p(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      if (((pNVar5->m_type).type & KEYVAL) == VAL) {
        _copy_props_wo_key(in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78,
                           in_stack_fffffffffffffb70,(size_t)in_stack_fffffffffffffb68);
      }
      else {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        handle_error(0x3f0daf,(char *)0x6641,"never reach this point");
      }
    }
  }
  return;
}

Assistant:

void Tree::merge_with(Tree const *src, size_t src_node, size_t dst_node)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    if(src_node == NONE)
        src_node = src->root_id();
    if(dst_node == NONE)
        dst_node = root_id();
    _RYML_CB_ASSERT(m_callbacks, src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node));

    if(src->has_val(src_node))
    {
        if( ! has_val(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
        }
        if(src->is_keyval(src_node))
            _copy_props(dst_node, src, src_node);
        else if(src->is_val(src_node))
            _copy_props_wo_key(dst_node, src, src_node);
        else
            C4_NEVER_REACH();
    }
    else if(src->is_seq(src_node))
    {
        if( ! is_seq(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_seq(dst_node, src->key(src_node));
            else
                to_seq(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = append_child(dst_node);
            _copy_props_wo_key(dch, src, sch);
            merge_with(src, sch, dch);
        }
    }
    else if(src->is_map(src_node))
    {
        if( ! is_map(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_map(dst_node, src->key(src_node));
            else
                to_map(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = find_child(dst_node, src->key(sch));
            if(dch == NONE)
            {
                dch = append_child(dst_node);
                _copy_props(dch, src, sch);
            }
            merge_with(src, sch, dch);
        }
    }
    else
    {
        C4_NEVER_REACH();
    }
}